

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QRegion __thiscall
QGraphicsItem::boundingRegion(QGraphicsItem *this,QTransform *itemToDeviceTransform)

{
  undefined8 uVar1;
  undefined4 uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  QPointF *in_RDX;
  int iVar7;
  undefined8 *puVar8;
  QStyleOptionGraphicsItem *pQVar9;
  QRect *pQVar10;
  QRect *rect;
  long in_FS_OFFSET;
  byte bVar11;
  int iVar12;
  qreal qVar13;
  int iVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar17;
  uint uVar18;
  uint uVar19;
  QRect QVar20;
  QPainter p;
  QTransform unscale;
  QStyleOptionGraphicsItem option;
  QRect local_178;
  QRegion local_168;
  QRect local_160;
  undefined1 *local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  double local_130;
  double local_128;
  undefined1 local_120 [8];
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined1 *local_108;
  QSize local_100;
  QRect local_f8;
  QRect local_e8 [5];
  undefined1 local_98 [8];
  qreal qStack_90;
  double local_88;
  double dStack_80;
  long local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar13 = boundingRegionGranularity((QGraphicsItem *)itemToDeviceTransform);
  (**(code **)((long)itemToDeviceTransform->m_matrix[0][0] + 0x18))(local_e8,itemToDeviceTransform);
  uVar2 = QTransform::mapRect((QRectF *)local_98);
  auVar14._0_8_ =
       (double)((ulong)local_98 & 0x8000000000000000 | 0x3fe0000000000000) + (double)local_98;
  auVar14._8_8_ = (double)((ulong)qStack_90 & 0x8000000000000000 | 0x3fe0000000000000) + qStack_90;
  auVar15 = maxpd(auVar14,_DAT_006605e0);
  iVar12 = (int)(double)(~-(ulong)(2147483647.0 < auVar14._0_8_) & auVar15._0_8_ |
                        -(ulong)(2147483647.0 < auVar14._0_8_) & 0x41dfffffffc00000);
  iVar16 = (int)(double)(~-(ulong)(2147483647.0 < auVar14._8_8_) & auVar15._8_8_ |
                        -(ulong)(2147483647.0 < auVar14._8_8_) & 0x41dfffffffc00000);
  local_88 = ((double)local_98 - (double)iVar12) * 0.5 + local_88;
  dStack_80 = (qStack_90 - (double)iVar16) * 0.5 + dStack_80;
  local_88 = (double)((ulong)local_88 & 0x8000000000000000 | 0x3fe0000000000000) + local_88;
  dStack_80 = (double)((ulong)dStack_80 & 0x8000000000000000 | 0x3fe0000000000000) + dStack_80;
  auVar15._4_4_ = -(uint)(DAT_006605e0._8_8_ < local_88);
  auVar15._0_4_ = -(uint)((double)DAT_006605e0 < dStack_80);
  auVar15._8_4_ = -(uint)(2147483647.0 < dStack_80);
  auVar15._12_4_ = -(uint)(2147483647.0 < local_88);
  uVar3 = movmskps(uVar2,auVar15);
  iVar5 = (int)local_88;
  if ((uVar3 & 2) == 0) {
    iVar5 = -0x80000000;
  }
  if ((uVar3 & 8) != 0) {
    iVar5 = 0x7fffffff;
  }
  iVar7 = (int)dStack_80;
  if ((uVar3 & 1) == 0) {
    iVar7 = -0x80000000;
  }
  if ((uVar3 & 4) != 0) {
    iVar7 = 0x7fffffff;
  }
  local_f8._0_8_ = CONCAT44(iVar16,iVar12);
  local_f8.x2.m_i = iVar12 + iVar5 + -1;
  if (iVar5 == 0) {
    local_f8.x2.m_i = iVar12;
  }
  local_f8.y2.m_i = iVar16 + iVar7 + -1;
  if (iVar7 == 0) {
    local_f8.y2.m_i = iVar16;
  }
  if ((qVar13 != 0.0) || (NAN(qVar13))) {
    uVar3 = (uint)(qVar13 * (double)((local_f8.x2.m_i - iVar12) + 1));
    uVar17 = (uint)(qVar13 * (double)((local_f8.y2.m_i - iVar16) + 1));
    uVar18 = -(uint)(-1 < (int)uVar3);
    uVar19 = -(uint)(-1 < (int)uVar17);
    local_100.wd.m_i = (uVar18 ^ 0xffffffff | uVar3 & uVar18) + 2;
    local_100.ht.m_i = (uVar19 ^ 0xffffffff | uVar17 & uVar19) + 2;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_118,&local_100,Format_ARGB32_Premultiplied);
    QImage::fill((uint)(QImage *)&local_118);
    local_120 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)local_120,(QPaintDevice *)&local_118);
    QPainter::setRenderHints((QPointF *)local_120,1,1);
    local_98 = (undefined1  [8])0x0;
    qStack_90 = 0.0;
    auVar15 = QTransform::map(in_RDX);
    local_130 = auVar15._0_8_ - (double)local_f8.x1.m_i;
    local_128 = auVar15._8_8_ - (double)local_f8.y1.m_i;
    QPainter::scale(qVar13,qVar13);
    QPainter::translate((QPointF *)local_120);
    local_98 = (undefined1  [8])0x3ff0000000000000;
    qStack_90 = 1.0;
    QPainter::translate((QPointF *)local_120);
    QPainter::setWorldTransform((QTransform *)local_120,SUB81(in_RDX,0));
    QTransform::inverted((bool *)local_98);
    local_148 = (undefined1 *)0x0;
    puStack_140 = (undefined1 *)0x0;
    local_e8[0] = (QRect)QTransform::map((QPointF *)local_98);
    QPainter::translate((QPointF *)local_120);
    puVar8 = &DAT_006f1718;
    pQVar9 = (QStyleOptionGraphicsItem *)local_98;
    for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar1 = *puVar8;
      (pQVar9->super_QStyleOption).version = (int)uVar1;
      (pQVar9->super_QStyleOption).type = (int)((ulong)uVar1 >> 0x20);
      puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
      pQVar9 = (QStyleOptionGraphicsItem *)((long)pQVar9 + (ulong)bVar11 * -0x10 + 8);
    }
    QStyleOptionGraphicsItem::QStyleOptionGraphicsItem((QStyleOptionGraphicsItem *)local_98);
    (**(code **)((long)itemToDeviceTransform->m_matrix[0][0] + 0x50))
              (itemToDeviceTransform,(QPointF *)local_120,(QStyleOptionGraphicsItem *)local_98,0);
    QPainter::end();
    puVar8 = &DAT_006f1ed0;
    pQVar10 = local_e8;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar1 = *puVar8;
      pQVar10->x1 = (Representation)(int)uVar1;
      pQVar10->y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
      puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
      pQVar10 = (QRect *)&pQVar10[-(ulong)bVar11].x2;
    }
    QTransform::fromScale(1.0 / qVar13,1.0 / qVar13);
    this->_vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::createMaskFromColor(&local_160,&local_118,0,0);
    QBitmap::fromImage((QBitmap *)&local_148,&local_160,0);
    QImage::~QImage((QImage *)&local_160);
    QRegion::QRegion(&local_168,(QBitmap *)&local_148);
    lVar6 = QRegion::begin();
    lVar4 = QRegion::end();
    if (lVar6 != lVar4) {
      do {
        auVar15 = QTransform::mapRect(local_e8);
        local_178._0_8_ =
             (ulong)((local_f8.x1.m_i + auVar15._0_4_) - 2) |
             (auVar15._0_8_ + -0x100000000 + (local_f8._0_8_ & 0xffffffff00000000) &
             0xffffffff00000000) - 0x100000000;
        local_178._8_8_ =
             (ulong)(uint)(auVar15._8_4_ + local_f8.x1.m_i) |
             (local_f8._0_8_ & 0xffffffff00000000) + auVar15._8_8_ & 0xffffffff00000000;
        QVar20 = (QRect)QRect::operator&(&local_178,&local_f8);
        local_160 = QVar20;
        QRegion::operator+=((QRegion *)this,&local_160);
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != lVar4);
    }
    QRegion::~QRegion(&local_168);
    QBitmap::~QBitmap((QBitmap *)&local_148);
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
    QPainter::~QPainter((QPainter *)local_120);
    QImage::~QImage((QImage *)&local_118);
  }
  else {
    QRegion::QRegion((QRegion *)this,&local_f8,Rectangle);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QGraphicsItem::boundingRegion(const QTransform &itemToDeviceTransform) const
{
    // ### Ideally we would have a better way to generate this region,
    // preferably something in the lines of QPainterPath::toRegion(QTransform)
    // coupled with a way to generate a painter path from a set of painter
    // operations (e.g., QPicture::toPainterPath() or so). The current
    // approach generates a bitmap with the size of the item's bounding rect
    // in device coordinates, scaled by b.r.granularity, then paints the item
    // into the bitmap, converts the result to a QRegion and scales the region
    // back to device space with inverse granularity.
    qreal granularity = boundingRegionGranularity();
    QRect deviceRect = itemToDeviceTransform.mapRect(boundingRect()).toRect();
    _q_adjustRect(&deviceRect);
    if (granularity == 0.0)
        return QRegion(deviceRect);

    int pad = 1;
    QSize bitmapSize(qMax(1, int(deviceRect.width() * granularity) + pad * 2),
                     qMax(1, int(deviceRect.height() * granularity) + pad * 2));
    QImage mask(bitmapSize, QImage::Format_ARGB32_Premultiplied);
    mask.fill(0);
    QPainter p(&mask);
    p.setRenderHints(QPainter::Antialiasing);

    // Transform painter (### this code is from QGraphicsScene::drawItemHelper
    // and doesn't work properly with perspective transformations).
    QPointF viewOrigo = itemToDeviceTransform.map(QPointF(0,  0));
    QPointF offset = viewOrigo - deviceRect.topLeft();
    p.scale(granularity, granularity);
    p.translate(offset);
    p.translate(pad, pad);
    p.setWorldTransform(itemToDeviceTransform, true);
    p.translate(itemToDeviceTransform.inverted().map(QPointF(0, 0)));

    // Render
    QStyleOptionGraphicsItem option;
    const_cast<QGraphicsItem *>(this)->paint(&p, &option, nullptr);
    p.end();

    // Transform QRegion back to device space
    QTransform unscale = QTransform::fromScale(1 / granularity, 1 / granularity);
    QRegion r;
    QBitmap colorMask = QBitmap::fromImage(mask.createMaskFromColor(0));
    for (const QRect &rect : QRegion(colorMask)) {
        QRect xrect = unscale.mapRect(rect).translated(deviceRect.topLeft() - QPoint(pad, pad));
        r += xrect.adjusted(-1, -1, 1, 1) & deviceRect;
    }
    return r;
}